

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

void __thiscall Fl_PostScript_Graphics_Driver::font(Fl_PostScript_Graphics_Driver *this,int f,int s)

{
  Fl_Surface_Device *this_00;
  char *pcVar1;
  char *p;
  char *name;
  Fl_Font_Descriptor *pFStack_28;
  float ps_size;
  Fl_Font_Descriptor *desc;
  Fl_Graphics_Driver *driver;
  int s_local;
  int f_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  driver._0_4_ = s;
  driver._4_4_ = f;
  _s_local = this;
  this_00 = &Fl_Display_Device::display_device()->super_Fl_Surface_Device;
  desc = (Fl_Font_Descriptor *)Fl_Surface_Device::driver(this_00);
  (*(((Fl_Graphics_Driver *)desc)->super_Fl_Device)._vptr_Fl_Device[0x36])
            (desc,(ulong)driver._4_4_,(ulong)(uint)driver);
  Fl_Graphics_Driver::font(&this->super_Fl_Graphics_Driver,driver._4_4_,(uint)driver);
  pFStack_28 = Fl_Graphics_Driver::font_descriptor((Fl_Graphics_Driver *)desc);
  Fl_Graphics_Driver::font_descriptor(&this->super_Fl_Graphics_Driver,pFStack_28);
  if ((int)driver._4_4_ < 0x10) {
    name._4_4_ = (float)(int)(uint)driver;
    fprintf((FILE *)this->output,"/%s SF\n",_fontNames[(int)driver._4_4_]);
    pcVar1 = strstr(*pFStack_28->font->font_name_list,"--");
    if (pcVar1 != (char *)0x0) {
      __isoc99_sscanf(pcVar1 + 2,"%f",(long)&name + 4);
    }
    clocale_printf(this,"%.1f FS\n",(double)name._4_4_);
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::font(int f, int s) {
  Fl_Graphics_Driver *driver = Fl_Display_Device::display_device()->driver();
  driver->font(f,s); // Use display fonts for font measurement
  Fl_Graphics_Driver::font(f, s);
  Fl_Font_Descriptor *desc = driver->font_descriptor();
  this->font_descriptor(desc);
  if (f < FL_FREE_FONT) {
    float ps_size = (float) s;
    fprintf(output, "/%s SF\n" , _fontNames[f]);
#if defined(USE_X11) 
#if USE_XFT
    // Xft font height is sometimes larger than the required size (see STR 2566).
    // Increase the PostScript font size by 15% without exceeding the display font height 
    int max = desc->font->height;
    ps_size = s * 1.15;
    if (ps_size > max) ps_size = max;
#else
    // Non-Xft fonts can be smaller than required.
    // Set the PostScript font size to the display font height 
    char *name = desc->font->font_name_list[0];
    char *p = strstr(name, "--");
    if (p) {
      sscanf(p + 2, "%f", &ps_size);
    }
#endif // USE_XFT
#endif // USE_X11
    clocale_printf("%.1f FS\n", ps_size);
  }
}